

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O1

void floor0_free_look(vorbis_look_floor *i)

{
  void *pvVar1;
  vorbis_look_floor0 *look;
  
  if (i != (vorbis_look_floor *)0x0) {
    if (*(undefined8 **)((long)i + 8) != (undefined8 *)0x0) {
      pvVar1 = (void *)**(undefined8 **)((long)i + 8);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      pvVar1 = *(void **)(*(long *)((long)i + 8) + 8);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      free(*(void **)((long)i + 8));
    }
    *(undefined8 *)((long)i + 0x20) = 0;
    *(undefined8 *)((long)i + 0x28) = 0;
    *(undefined8 *)((long)i + 0x10) = 0;
    *(undefined8 *)((long)i + 0x18) = 0;
    *(undefined8 *)i = 0;
    *(undefined8 *)((long)i + 8) = 0;
    free(i);
    return;
  }
  return;
}

Assistant:

static void floor0_free_look(vorbis_look_floor *i){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  if(look){

    if(look->linearmap){

      if(look->linearmap[0])_ogg_free(look->linearmap[0]);
      if(look->linearmap[1])_ogg_free(look->linearmap[1]);

      _ogg_free(look->linearmap);
    }
    memset(look,0,sizeof(*look));
    _ogg_free(look);
  }
}